

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

int next_format(png_bytep colour_type,png_bytep bit_depth,uint *palette_number,int low_depth_gray,
               int tRNS)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  if (*bit_depth == '\0') {
    *colour_type = '\0';
    iVar3 = 8;
    if (low_depth_gray != 0) {
      iVar3 = 1;
    }
    *bit_depth = (png_byte)iVar3;
    *palette_number = 0;
    return 1;
  }
  if (*colour_type < 4) {
    uVar2 = *palette_number + 1;
    *palette_number = uVar2;
    if ((tRNS != 0 && (*colour_type & 0xfd) == 0) && uVar2 < 2) {
      return 1;
    }
    if (*colour_type == 3) {
      uVar4 = 0x10;
      if (4 < *bit_depth) {
        uVar4 = 1;
      }
      if (uVar2 < uVar4) {
        return 1;
      }
    }
    *palette_number = 0;
  }
  bVar1 = *bit_depth * '\x02';
  *bit_depth = bVar1;
  if (bVar1 < 9) {
    return 1;
  }
  if (bVar1 < 0x11 && *colour_type != '\x03') {
    return 1;
  }
  iVar3 = 0;
  switch(*colour_type) {
  case '\0':
    *colour_type = '\x02';
    break;
  default:
    goto switchD_0010a6b7_caseD_1;
  case '\x02':
    *colour_type = '\x03';
    *bit_depth = '\x01';
    goto LAB_0010a6ec;
  case '\x03':
    *colour_type = '\x04';
    break;
  case '\x04':
    *colour_type = '\x06';
  }
  *bit_depth = '\b';
LAB_0010a6ec:
  iVar3 = 1;
switchD_0010a6b7_caseD_1:
  return iVar3;
}

Assistant:

static int
next_format(png_bytep colour_type, png_bytep bit_depth,
   unsigned int* palette_number, int low_depth_gray, int tRNS)
{
   if (*bit_depth == 0)
   {
      *colour_type = 0;
      if (low_depth_gray)
         *bit_depth = 1;
      else
         *bit_depth = 8;
      *palette_number = 0;
      return 1;
   }

   if  (*colour_type < 4/*no alpha channel*/)
   {
      /* Add multiple palettes for colour type 3, one image with tRNS
       * and one without for other non-alpha formats:
       */
      unsigned int pn = ++*palette_number;
      png_byte ct = *colour_type;

      if (((ct == 0/*GRAY*/ || ct/*RGB*/ == 2) && tRNS && pn < 2) ||
          (ct == 3/*PALETTE*/ && pn < PALETTE_COUNT(*bit_depth)))
         return 1;

      /* No: next bit depth */
      *palette_number = 0;
   }

   *bit_depth = (png_byte)(*bit_depth << 1);

   /* Palette images are restricted to 8 bit depth */
   if (*bit_depth <= 8
#ifdef DO_16BIT
         || (*colour_type != 3 && *bit_depth <= 16)
#endif
      )
      return 1;

   /* Move to the next color type, or return 0 at the end. */
   switch (*colour_type)
   {
      case 0:
         *colour_type = 2;
         *bit_depth = 8;
         return 1;

      case 2:
         *colour_type = 3;
         *bit_depth = 1;
         return 1;

      case 3:
         *colour_type = 4;
         *bit_depth = 8;
         return 1;

      case 4:
         *colour_type = 6;
         *bit_depth = 8;
         return 1;

      default:
         return 0;
   }
}